

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O1

void __thiscall Crc32::GenerateTable(Crc32 *this,uint32_t polynomial,bool reflectIn,bool reflectOut)

{
  int byte;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = 0;
  do {
    uVar2 = (uint)uVar1;
    uVar4 = uVar1 & 0xffffffff;
    if (reflectIn) {
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = (uVar2 & 0xf0f0f0f) << 4 | uVar2 >> 4 & 0xf0f0f0f;
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333) * 4;
      uVar4 = (ulong)((uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555) * 2 >> 0x18);
    }
    uVar2 = 0x21;
    do {
      uVar3 = (int)uVar4 >> 0x1f & polynomial ^ (int)uVar4 * 2;
      uVar4 = (ulong)uVar3;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar2 = (uVar2 & 0xf0f0f0f) << 4 | uVar2 >> 4 & 0xf0f0f0f;
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333) * 4;
    uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555) * 2;
    if (!reflectOut) {
      uVar2 = uVar3;
    }
    (this->crcTable)._M_elems[uVar1] = uVar2;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  return;
}

Assistant:

void Crc32::GenerateTable(uint32_t polynomial, bool reflectIn, bool reflectOut)
{
  for (int byte = 0; byte < 256; ++byte)
  {
    uint32_t crc = (reflectIn ? (Reverse(uint32_t(byte)) >> 24) : byte);

    for (int bit = 32; bit > 0; --bit)
    {
      if (crc & 0x80000000)
      {
        crc = (crc << 1) ^ polynomial;
      }
      else
      {
        crc <<= 1;
      }
    }

    crcTable[byte] = (reflectOut ? Reverse(crc) : crc);
  }
}